

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TablePrinter.hpp
# Opt level: O1

void __thiscall
trl::TablePrinter::TablePrinter(TablePrinter *this,ostream *output,string *separator)

{
  pointer pcVar1;
  
  this->m_outStream = output;
  (this->m_columnTitles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_columnTitles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_columnTitles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_columnWidths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_columnWidths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_columnWidths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_columnSeparator)._M_dataplus._M_p = (pointer)&(this->m_columnSeparator).field_2;
  pcVar1 = (separator->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_columnSeparator,pcVar1,pcVar1 + separator->_M_string_length);
  *(undefined8 *)((long)&this->m_columnIndex + 1) = 0;
  this->m_rowIndex = 0;
  this->m_columnIndex = 0;
  return;
}

Assistant:

explicit TablePrinter(std::ostream& output = std::cout, const std::string& separator = "|")
                : m_outStream(output),
                  m_columnSeparator(separator) {

        }